

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkInvertConstraints(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  int i;
  
  if (pNtk->nConstrs != 0) {
    for (i = 0; i < pNtk->vPos->nSize; i = i + 1) {
      pAVar1 = Abc_NtkPo(pNtk,i);
      if (pNtk->vPos->nSize - pNtk->nConstrs <= i) {
        pAVar1->field_0x15 = pAVar1->field_0x15 ^ 4;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkInvertConstraints( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    if ( Abc_NtkConstrNum(pNtk) == 0 )
        return;
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
            Abc_ObjXorFaninC( pObj, 0 );
    }
}